

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::one_thread::impl::disp_binder_t::unbind_agent
          (disp_binder_t *this,environment_t *env,agent_ref_t *agent_ref)

{
  element_type *disp;
  intrusive_ptr_t<so_5::agent_t> local_38;
  __shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2> local_30;
  agent_ref_t *local_20;
  agent_ref_t *agent_ref_local;
  environment_t *env_local;
  disp_binder_t *this_local;
  
  local_20 = agent_ref;
  agent_ref_local = (agent_ref_t *)env;
  env_local = (environment_t *)this;
  environment_t::query_named_dispatcher((environment_t *)&local_30,(string *)env);
  disp = std::__shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2>::get(&local_30);
  intrusive_ptr_t<so_5::agent_t>::intrusive_ptr_t(&local_38,agent_ref);
  unbind_agent_from_disp(this,disp,&local_38);
  intrusive_ptr_t<so_5::agent_t>::~intrusive_ptr_t(&local_38);
  std::shared_ptr<so_5::dispatcher_t>::~shared_ptr((shared_ptr<so_5::dispatcher_t> *)&local_30);
  return;
}

Assistant:

virtual void
		unbind_agent(
			environment_t & env,
			agent_ref_t agent_ref ) override
		{
			return unbind_agent_from_disp( 
				env.query_named_dispatcher( m_disp_name ).get(),
				std::move( agent_ref ) );
		}